

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoCaps.cpp
# Opt level: O1

double __thiscall TwoCaps::coordinateY(TwoCaps *this,int J,int K,int L,int G)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  if (G == 2) {
    this->theta1 = this->d_theta1_cap * (double)J + this->theta1_cap_lb;
    dVar3 = this->d_theta2_cap * (double)K + this->theta2_cap_lb;
    this->theta2 = dVar3;
    cos(dVar3);
    dVar1 = (this->super_Parameterization).x_ub - (double)J * (this->super_Parameterization).dx;
    dVar3 = (this->super_Parameterization).z_lb;
    (this->super_Parameterization).x = dVar1;
    dVar2 = (double)K * (this->super_Parameterization).dy + (this->super_Parameterization).y_lb;
    (this->super_Parameterization).y = dVar2;
  }
  else {
    if (G != 1) {
      if (G == 0) {
        this->theta1 = (double)J * this->d_theta1 + this->theta1_lb;
        dVar1 = (double)K * this->d_theta2 + this->theta2_lb;
        this->theta2 = dVar1;
        dVar3 = (this->super_Parameterization).radius;
        dVar1 = sin(dVar1);
        dVar2 = cos(this->theta1);
        (this->super_Parameterization).y = dVar2 * dVar1 * dVar3;
      }
      goto LAB_00105633;
    }
    this->theta1 = this->d_theta1_cap * (double)J + this->theta1_cap_lb;
    dVar3 = this->d_theta2_cap * (double)K + this->theta2_cap_lb;
    this->theta2 = dVar3;
    cos(dVar3);
    dVar1 = (double)J * (this->super_Parameterization).dx + (this->super_Parameterization).x_lb;
    (this->super_Parameterization).x = dVar1;
    dVar2 = (double)K * (this->super_Parameterization).dy + (this->super_Parameterization).y_lb;
    (this->super_Parameterization).y = dVar2;
    dVar3 = (this->super_Parameterization).z_ub;
  }
  (this->super_Parameterization).z = dVar3;
  dVar3 = dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  this->rad_B = dVar3;
  dVar3 = (this->super_Parameterization).radius / dVar3;
  this->proj = dVar3;
  (this->super_Parameterization).y = dVar3 * (this->super_Parameterization).y;
LAB_00105633:
  return (this->super_Parameterization).y;
}

Assistant:

double TwoCaps::coordinateY(int J, int K, int L, int G) {
  switch (G) {
    case 0:  // Low latitude spherical shell
      theta1 = theta1_lb + (double)J * d_theta1;
      theta2 = theta2_lb + (double)K * d_theta2;
      y = radius * sin(theta2) * cos(theta1);
      break;
    case 1:  // Top cap
      theta1 = theta1_cap_lb + (double)J * d_theta1_cap;
      theta2 = theta2_cap_lb + (double)K * d_theta2_cap;
      y = -radius * cos(theta2);

      x = x_lb + (double)J * dx;
      y = y_lb + (double)K * dy;
      z = z_ub;

      rad_B = sqrt(x * x + y * y + z * z);
      proj = radius / rad_B;
      y *= proj;
      break;
    case 2:  // Bottom cap
      theta1 = theta1_cap_lb + (double)J * d_theta1_cap;
      theta2 = theta2_cap_lb + (double)K * d_theta2_cap;
      y =  radius * cos(theta2);

      x = x_ub - (double)J * dx;
      y = y_lb + (double)K * dy;
      z = z_lb;

      rad_B = sqrt(x * x + y * y + z * z);
      proj = radius / rad_B;
      y *= proj;
      break;
  }

  return y;
}